

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearUV
               (ImDrawVert *vert_start,ImDrawVert *vert_end,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
               ImVec2 *uv_b,bool clamp)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float local_d4;
  float local_cc;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImDrawVert *local_a8;
  ImDrawVert *vertex_1;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImDrawVert *local_70;
  ImDrawVert *vertex;
  ImVec2 max;
  ImVec2 min;
  ImVec2 scale;
  ImVec2 uv_size;
  ImVec2 size;
  bool clamp_local;
  ImVec2 *uv_b_local;
  ImVec2 *uv_a_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawVert *vert_end_local;
  ImDrawVert *vert_start_local;
  
  IVar1 = ::operator-(b,a);
  IVar2 = ::operator-(uv_b,uv_a);
  uv_size.x = IVar1.x;
  if ((uv_size.x != 0.0) || (NAN(uv_size.x))) {
    scale.x = IVar2.x;
    local_cc = scale.x / uv_size.x;
  }
  else {
    local_cc = 0.0;
  }
  uv_size.y = IVar1.y;
  if ((uv_size.y != 0.0) || (NAN(uv_size.y))) {
    scale.y = IVar2.y;
    local_d4 = scale.y / uv_size.y;
  }
  else {
    local_d4 = 0.0;
  }
  ImVec2::ImVec2(&min,local_cc,local_d4);
  local_a8 = vert_start;
  if (clamp) {
    max = ImMin(uv_a,uv_b);
    register0x00001200 = ImMax(uv_a,uv_b);
    for (local_70 = vert_start; local_70 < vert_end; local_70 = local_70 + 1) {
      ImVec2::ImVec2(&local_98,(local_70->pos).x,(local_70->pos).y);
      local_90 = ::operator-(&local_98,a);
      local_88 = ImMul(&local_90,&min);
      local_80 = ::operator+(uv_a,&local_88);
      vertex_1 = (ImDrawVert *)stack0xffffffffffffff9c;
      local_78 = ImClamp(&local_80,&max,stack0xffffffffffffff9c);
      local_70->uv = local_78;
    }
  }
  else {
    for (; local_a8 < vert_end; local_a8 = local_a8 + 1) {
      ImVec2::ImVec2(&local_c8,(local_a8->pos).x,(local_a8->pos).y);
      local_c0 = ::operator-(&local_c8,a);
      local_b8 = ImMul(&local_c0,&min);
      local_b0 = ::operator+(uv_a,&local_b8);
      local_a8->uv = local_b0;
    }
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawVert* vert_start, ImDrawVert* vert_end, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);

        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}